

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O0

void mcpl_enable_userflags(mcpl_outfile_t of)

{
  mcpl_outfile_t in_RDI;
  mcpl_outfileinternal_t *f;
  
  if (*(int *)((long)in_RDI.internal + 0x48) == 0) {
    if (*(int *)((long)in_RDI.internal + 0x60) == 0) {
      mcpl_error((char *)0x1032b7);
    }
    *(undefined4 *)((long)in_RDI.internal + 0x48) = 1;
    mcpl_recalc_psize(in_RDI);
  }
  return;
}

Assistant:

void mcpl_enable_userflags(mcpl_outfile_t of)
{
  MCPLIMP_OUTFILEDECODE;
  if (f->opt_userflags)
    return;
  if (!f->header_notwritten)
    mcpl_error("mcpl_enable_userflags called too late.");
  f->opt_userflags = 1;
  mcpl_recalc_psize(of);
}